

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall
Fl_Text_Buffer::findchar_backward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  if ((0 < startPos) && (iVar1 = this->mLength, iVar1 != 0)) {
    if (iVar1 < startPos) {
      startPos = iVar1;
    }
    do {
      startPos = prev_char_clipped(this,startPos);
      uVar2 = char_at(this,startPos);
      if (uVar2 == searchChar) {
        iVar3 = 1;
        goto LAB_001cfde0;
      }
    } while (startPos != 0);
  }
  startPos = 0;
LAB_001cfde0:
  *foundPos = startPos;
  return iVar3;
}

Assistant:

int Fl_Text_Buffer::findchar_backward(int startPos, unsigned int searchChar,
				      int *foundPos) const {
  if (startPos <= 0) {
    *foundPos = 0;
    return 0;
  }
  
  if (startPos > mLength)
    startPos = mLength;
  
  for (startPos = prev_char(startPos); startPos>=0; startPos = prev_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = 0;
  return 0;
}